

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::init(VertexCubeTextureCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  pointer pPVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  RenderTarget *pRVar4;
  ShaderProgram *this_00;
  TextureCube *this_01;
  NotSupportedError *pNVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  pointer_____offset_0x10___ *ppuVar9;
  TextureFormatInfo *__return_storage_ptr__;
  int levelNdx;
  long lVar10;
  int face;
  uint uVar11;
  int face_1;
  long lVar12;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_3;
  ProgramSources sources;
  int local_1ac;
  RGBA local_1a0;
  RGBA local_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  long local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  Vec4 local_118;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [40];
  
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar4->m_numSamples != 0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_108 = (undefined1  [8])local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"MSAA config not supported by this test","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_108);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,
             "attribute highp vec2 a_position;\nattribute highp vec3 a_texCoord;\nuniform highp samplerCube u_texture;\nuniform highp float u_lod;\nvarying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,"");
  local_188 = (undefined1  [8])&local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "varying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n","");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_108,0,0xac);
  local_58._0_8_ = (pointer)0x0;
  local_58[8] = 0;
  local_58._9_7_ = 0;
  local_58[0x10] = 0;
  local_58._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108,(value_type *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f8 + 8),(value_type *)local_188);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_108);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_78);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if (local_188 != (undefined1  [8])&local_178) {
    operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk == true) {
    lVar8 = 0;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      this_01 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x20);
      this->m_textures[lVar8] = this_01;
      lVar8 = 1;
      bVar2 = false;
    } while (bVar6);
    __return_storage_ptr__ = (TextureFormatInfo *)local_108;
    tcu::getTextureFormatInfo(__return_storage_ptr__,&(this->m_textures[0]->m_refTexture).m_format);
    local_148 = (float)local_108._0_4_;
    fStack_144 = (float)local_108._4_4_;
    fStack_140 = fStack_100;
    fStack_13c = fStack_fc;
    if (init()::gradients == '\0') {
      local_198 = (float)local_f8._0_4_;
      fStack_194 = (float)local_f8._4_4_;
      fStack_190 = (float)local_f8._8_4_;
      fStack_18c = (float)local_f8._12_4_;
      init((EVP_PKEY_CTX *)__return_storage_ptr__);
      local_f8._0_4_ = local_198;
      local_f8._4_4_ = fStack_194;
      local_f8._8_4_ = fStack_190;
      local_f8._12_4_ = fStack_18c;
    }
    local_198 = (float)local_f8._0_4_ - local_148;
    fStack_194 = (float)local_f8._4_4_ - fStack_144;
    fStack_190 = (float)local_f8._8_4_ - fStack_140;
    fStack_18c = (float)local_f8._12_4_ - fStack_13c;
    lVar8 = 0;
    do {
      lVar12 = 0;
      lVar10 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_textures[0]->m_refTexture,(CubeFace)lVar8,(int)lVar10)
        ;
        fStack_160 = init::gradients[lVar8][0].m_data[2] * fStack_190 + fStack_140;
        fStack_15c = init::gradients[lVar8][0].m_data[3] * fStack_18c + fStack_13c;
        local_168._4_4_ = init::gradients[lVar8][0].m_data[1] * fStack_194 + fStack_144;
        local_168._0_4_ = init::gradients[lVar8][0].m_data[0] * local_198 + local_148;
        fStack_180 = init::gradients[lVar8][1].m_data[2] * fStack_190 + fStack_140;
        fStack_17c = init::gradients[lVar8][1].m_data[3] * fStack_18c + fStack_13c;
        local_188._4_4_ = init::gradients[lVar8][1].m_data[1] * fStack_194 + fStack_144;
        local_188._0_4_ = init::gradients[lVar8][1].m_data[0] * local_198 + local_148;
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   ((long)(this->m_textures[0]->m_refTexture).m_access[lVar8].
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar12),(Vec4 *)local_168,
                   (Vec4 *)local_188);
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x28;
      } while (lVar10 != 6);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    iVar3 = 0;
    local_1ac = 0;
    lVar8 = 0;
    do {
      uVar7 = 0xffffffff;
      local_130 = lVar8 * 3;
      uVar11 = 0;
      lVar10 = 0;
      lVar12 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_textures[1]->m_refTexture,(CubeFace)lVar8,(int)lVar12)
        ;
        local_19c.m_value = uVar11 | 0xff000000;
        pPVar1 = (&(this->m_textures[1]->m_refTexture).m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_130];
        tcu::RGBA::toVec(&local_19c);
        local_1a0.m_value = uVar7 | 0xff000000;
        fStack_160 = fStack_180 * fStack_190 + fStack_140;
        fStack_15c = fStack_17c * fStack_18c + fStack_13c;
        local_168._4_4_ = (float)local_188._4_4_ * fStack_194 + fStack_144;
        local_168._0_4_ = (float)local_188._0_4_ * local_198 + local_148;
        tcu::RGBA::toVec(&local_1a0);
        local_118.m_data[0] = local_128 * local_198 + local_148;
        local_118.m_data[1] = fStack_124 * fStack_194 + fStack_144;
        local_118.m_data[2] = fStack_120 * fStack_190 + fStack_140;
        local_118.m_data[3] = fStack_11c * fStack_18c + fStack_13c;
        tcu::fillWithGrid((PixelBufferAccess *)
                          ((long)&pPVar1->super_ConstPixelBufferAccess + lVar10),4,(Vec4 *)local_168
                          ,&local_118);
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0x28;
        uVar7 = uVar7 + local_1ac;
        uVar11 = uVar11 + iVar3;
      } while (lVar12 != 6);
      lVar8 = lVar8 + 1;
      local_1ac = local_1ac + -0x71c71;
      iVar3 = iVar3 + 0x71c71;
    } while (lVar8 != 6);
    glu::TextureCube::upload(this->m_textures[0]);
    glu::TextureCube::upload(this->m_textures[1]);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,(GLint *)local_108);
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((int)local_108._0_4_ < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Vertex texture image units not supported",
               ::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x307);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar5,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x309);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar5,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

void VertexCubeTextureCase::init (void)
{
	const char* const vertexShader =
		"attribute highp vec2 a_position;\n"
		"attribute highp vec3 a_texCoord;\n"
		"uniform highp samplerCube u_texture;\n"
		"uniform highp float u_lod;\n"
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_WIDTH / 3 / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_HEIGHT / 2 / 2);

		DE_ASSERT(texWidth == texHeight);
		DE_UNREF(texHeight);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::TextureCube(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth);
		}

		const bool						mipmaps		= deIsPowerOfTwo32(texWidth) != DE_FALSE;
		const int						numLevels	= mipmaps ? deLog2Floor32(texWidth)+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		static const Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ Vec4(-1.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ Vec4( 0.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ Vec4(-1.0f,  0.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ Vec4(-1.0f, -1.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ Vec4(-1.0f, -1.0f, -1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ Vec4( 0.0f,  0.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_textures[0]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				const deUint32 step		= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				const deUint32 rgb		= step*levelNdx*face;
				const deUint32 colorA	= 0xff000000 | rgb;
				const deUint32 colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		VertexCubeTextureCase::deinit();
		throw;
	}
}